

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O0

size_type __thiscall
lf::assemble::UniformFEDofHandler::NumInteriorDofs(UniformFEDofHandler *this,RefEl ref_el_type)

{
  RefElType RVar1;
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  size_type local_1c;
  UniformFEDofHandler *pUStack_18;
  size_type no_loc_dofs;
  UniformFEDofHandler *this_local;
  RefEl ref_el_type_local;
  
  pUStack_18 = this;
  this_local._7_1_ = ref_el_type.type_;
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 7));
  switch(RVar1) {
  case kPoint:
    local_1c = this->num_loc_dof_point_;
    break;
  case kSegment:
    local_1c = this->num_loc_dof_segment_;
    break;
  case kTria:
    local_1c = this->num_loc_dof_tria_;
    break;
  case kQuad:
    local_1c = this->num_loc_dof_quad_;
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Illegal entity type");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x1d8,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_1c;
}

Assistant:

[[nodiscard]] size_type NumInteriorDofs(lf::base::RefEl ref_el_type) const {
    size_type no_loc_dofs;
    switch (ref_el_type) {
      case lf::base::RefEl::kPoint(): {
        no_loc_dofs = num_loc_dof_point_;
        break;
      }
      case lf::base::RefEl::kSegment(): {
        no_loc_dofs = num_loc_dof_segment_;
        break;
      }
      case lf::base::RefEl::kTria(): {
        no_loc_dofs = num_loc_dof_tria_;
        break;
      }
      case lf::base::RefEl::kQuad(): {
        no_loc_dofs = num_loc_dof_quad_;
        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal entity type");
        break;
      }
    }  // end switch
    return no_loc_dofs;
  }